

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O2

cJSON * cJSON_CreateDoubleArray(double *numbers,int count)

{
  cJSON *item;
  cJSON *pcVar1;
  ulong uVar2;
  cJSON *pcVar3;
  
  if ((numbers != (double *)0x0 && -1 < count) && (item = cJSON_CreateArray(), item != (cJSON *)0x0)
     ) {
    uVar2 = 0;
    pcVar3 = (cJSON *)0x0;
    while( true ) {
      if ((uint)count == uVar2) {
        return item;
      }
      pcVar1 = cJSON_CreateNumber(numbers[uVar2]);
      if (pcVar1 == (cJSON *)0x0) break;
      if (uVar2 == 0) {
        item->child = pcVar1;
      }
      else {
        pcVar3->next = pcVar1;
        pcVar1->prev = pcVar3;
      }
      uVar2 = uVar2 + 1;
      pcVar3 = pcVar1;
    }
    cJSON_Delete(item);
  }
  return (cJSON *)0x0;
}

Assistant:

CJSON_PUBLIC(cJSON *) cJSON_CreateDoubleArray(const double *numbers, int count)
{
    size_t i = 0;
    cJSON *n = NULL;
    cJSON *p = NULL;
    cJSON *a = NULL;

    if ((count < 0) || (numbers == NULL))
    {
        return NULL;
    }

    a = cJSON_CreateArray();

    for(i = 0;a && (i < (size_t)count); i++)
    {
        n = cJSON_CreateNumber(numbers[i]);
        if(!n)
        {
            cJSON_Delete(a);
            return NULL;
        }
        if(!i)
        {
            a->child = n;
        }
        else
        {
            suffix_object(p, n);
        }
        p = n;
    }

    return a;
}